

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

char * cashew::JSPrinter::numToString(double d,bool finalize)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  uint64_t uVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  size_t sVar13;
  undefined4 *puVar14;
  char *pcVar15;
  char *__s;
  uint uVar16;
  undefined7 in_register_00000039;
  long lVar17;
  byte bVar18;
  char *pcVar19;
  bool bVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar23;
  double dVar24;
  double local_70;
  double temp;
  double local_60;
  undefined8 local_58;
  ulong uStack_50;
  uint local_44;
  undefined2 local_40;
  char cStack_3e;
  char cStack_3d;
  undefined1 auStack_3c [4];
  unsigned_long_long tempULL;
  
  local_44 = (uint)CONCAT71(in_register_00000039,finalize);
  if (NAN(d)) {
    pcVar7 = "-NaN";
    pcVar19 = "-NaN";
  }
  else {
    if ((ulong)ABS(d) < 0x7ff0000000000000) {
      uStack_50 = CONCAT44(in_XMM0_Dd,in_XMM0_Dc) ^ 0x8000000000000000;
      local_58 = -d;
      if (-d <= d) {
        local_58 = d;
      }
      tempULL._7_1_ = ::wasm::isInteger(local_58);
      lVar8 = __tls_get_addr(&PTR_01081508);
      pcVar7 = (char *)(lVar8 + 1);
      lVar8 = __tls_get_addr(&PTR_01083178);
      pcVar19 = (char *)(lVar8 + 1);
      local_44 = local_44 ^ 1;
      dVar23 = NAN;
      bVar20 = false;
      temp = (double)pcVar19;
      bVar5 = true;
      do {
        bVar4 = bVar5;
        __s = pcVar7;
        if (bVar20) {
          __s = pcVar19;
        }
        local_60 = dVar23;
        if (tempULL._7_1_ == 0) {
          uVar16 = 0;
          do {
            local_40 = 0x2e25;
            if (uVar16 < 10) {
              cStack_3e = (char)uVar16 + '0';
              pcVar19 = &cStack_3d;
              puVar14 = (undefined4 *)auStack_3c;
            }
            else {
              cStack_3e = '1';
              cStack_3d = (char)uVar16 + '&';
              pcVar19 = auStack_3c;
              puVar14 = (undefined4 *)((long)auStack_3c + 1);
            }
            *pcVar19 = 'f' - bVar20;
            *(undefined1 *)puVar14 = 0;
            snprintf(__s,999,(char *)&local_40,(undefined4)local_58);
            __isoc99_sscanf(__s,"%lf",&local_70);
            pcVar19 = (char *)temp;
          } while (((local_70 != local_58) || (NAN(local_70) || NAN(local_58))) &&
                  (bVar5 = uVar16 < 0x12, uVar16 = uVar16 + 1, bVar5));
        }
        else {
          if (local_58 < 0.0) {
            __assert_fail("d >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                          ,0x3d2,"static char *cashew::JSPrinter::numToString(double, bool)");
          }
          bVar5 = ::wasm::isUInteger64(local_58);
          if (bVar5) {
            uVar9 = ::wasm::toUInteger64(local_58);
            bVar18 = bVar20 & (byte)local_44;
            pcVar19 = "%llu";
            if (bVar18 != 0) {
              pcVar19 = "0x%llx";
            }
            snprintf(__s,999,pcVar19,uVar9);
            pcVar19 = (char *)temp;
            if (bVar18 == 1) {
              __isoc99_sscanf(temp,"%llx",&local_40);
              local_70 = ((double)CONCAT44(0x45300000,auStack_3c) - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,
                                           CONCAT13(cStack_3d,CONCAT12(cStack_3e,local_40))) -
                         4503599627370496.0);
            }
            else {
              __isoc99_sscanf(__s,"%lf",&local_70);
              pcVar19 = (char *)temp;
            }
          }
          else {
            pcVar10 = "%.0f";
            if (bVar20 != false) {
              pcVar10 = "%e";
            }
            snprintf(__s,999,pcVar10,(undefined4)local_58);
            __isoc99_sscanf(__s,"%lf",&local_70);
          }
        }
        dVar24 = ABS(local_70 - (double)CONCAT44(local_58._4_4_,(undefined4)local_58));
        dVar23 = local_60;
        if (bVar20 == false) {
          dVar23 = dVar24;
        }
        pcVar10 = strchr(__s,0x2e);
        uVar21 = SUB84(local_60,0);
        uVar22 = (undefined4)((ulong)local_60 >> 0x20);
        if (pcVar10 == (char *)0x0) {
          if ((bVar20 & tempULL._7_1_) == 1) break;
          sVar12 = strlen(__s);
          uVar16 = 0xffff;
          lVar8 = 0;
          do {
            lVar1 = lVar8 + -1;
            uVar16 = uVar16 + 1;
            if ((long)(lVar8 + sVar12 + -1) < 0x19 && __s[lVar8 + -1 + sVar12] != '0') break;
            lVar17 = lVar8 + sVar12;
            lVar8 = lVar1;
          } while (__s < __s + lVar17 + -1);
          uVar3 = (uint)lVar1;
          uVar6 = ~uVar3;
          uVar21 = SUB84(local_60,0);
          uVar22 = (undefined4)((ulong)local_60 >> 0x20);
          if (2 < (int)uVar6) {
            __s[lVar1 + sVar12 + 1] = 'e';
            bVar18 = (byte)lVar1;
            if (uVar6 < 10) {
              bVar18 = ~bVar18;
              lVar8 = 3;
              lVar17 = 2;
            }
            else if (uVar6 < 100) {
              __s[lVar1 + sVar12 + 2] = (byte)((0xff - uVar3 & 0xff) / 10) | 0x30;
              bVar18 = ~(((byte)((uVar16 & 0xff) / 5) & 0xfe) * '\x05') - bVar18;
              lVar8 = 4;
              lVar17 = 3;
            }
            else {
              if (999 < uVar6) {
                __assert_fail("num < 1000",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                              ,0x418,"static char *cashew::JSPrinter::numToString(double, bool)");
              }
              __s[lVar1 + sVar12 + 2] = (byte)((~uVar3 & 0xffff) / 100) | 0x30;
              __s[lVar1 + sVar12 + 3] =
                   (byte)(((byte)~((char)((uVar16 & 0xffff) / 100) * 'd') - uVar3 & 0xff) / 10) |
                   0x30;
              bVar18 = ~(((byte)((uVar16 & 0xffff) / 5) & 0xfe) * '\x05') - bVar18;
              lVar8 = 5;
              lVar17 = 4;
            }
            __s[lVar1 + lVar17 + sVar12] = bVar18 | 0x30;
            __s[lVar1 + lVar8 + sVar12] = '\0';
          }
        }
        else {
          pcVar15 = pcVar10 + -1;
          do {
            pcVar10 = pcVar10 + 1;
            pcVar11 = pcVar15 + 2;
            pcVar15 = pcVar15 + 1;
          } while ((byte)(*pcVar11 - 0x30U) < 10);
          cVar2 = *pcVar15;
          while (pcVar11 = pcVar10, cVar2 == '0') {
            do {
              cVar2 = *pcVar11;
              pcVar11[-1] = cVar2;
              pcVar11 = pcVar11 + 1;
            } while (cVar2 != '\0');
            pcVar10 = pcVar10 + -1;
            pcVar11 = pcVar15 + -1;
            pcVar15 = pcVar15 + -1;
            cVar2 = *pcVar11;
          }
          while (pcVar10 = __s, *__s == '0') {
            do {
              pcVar15 = pcVar10 + 1;
              *pcVar10 = *pcVar15;
              pcVar10 = pcVar10 + 1;
            } while (*pcVar15 != '\0');
          }
        }
        bVar20 = true;
        bVar5 = false;
      } while (bVar4);
      if ((dVar24 != (double)CONCAT44(uVar22,uVar21)) ||
         (NAN(dVar24) || NAN((double)CONCAT44(uVar22,uVar21)))) {
        bVar20 = dVar24 <= (double)CONCAT44(uVar22,uVar21) &&
                 (double)CONCAT44(uVar22,uVar21) != dVar24;
      }
      else {
        sVar12 = strlen(pcVar19);
        sVar13 = strlen(pcVar7);
        bVar20 = sVar12 < sVar13;
      }
      if (bVar20) {
        pcVar7 = pcVar19;
      }
      if (0.0 <= d) {
        return pcVar7;
      }
      pcVar7[-1] = '-';
      return pcVar7 + -1;
    }
    pcVar7 = "-Infinity";
    pcVar19 = "-Infinity";
  }
  pcVar19 = pcVar19 + 1;
  if ((long)d < 0) {
    pcVar19 = pcVar7;
  }
  return pcVar19;
}

Assistant:

static char* numToString(double d, bool finalize = true) {
    if (std::isnan(d)) {
      if (std::signbit(d)) {
        return (char*)"-NaN";
      } else {
        return (char*)"NaN";
      }
    } else if (!std::isfinite(d)) {
      if (std::signbit(d)) {
        return (char*)"-Infinity";
      } else {
        return (char*)"Infinity";
      }
    }
    bool neg = d < 0;
    if (neg) {
      d = -d;
    }
    // try to emit the fewest necessary characters
    bool integer = wasm::isInteger(d);
#define BUFFERSIZE 1000
    // f is normal, e is scientific for float, x for integer
    // These need to be thread-local because they are returned.
    thread_local char full_storage_f[BUFFERSIZE];
    thread_local char full_storage_e[BUFFERSIZE];
    // full has one more char, for a possible '-'
    char* storage_f = full_storage_f + 1;
    char* storage_e = full_storage_e + 1;
    auto err_f = std::numeric_limits<double>::quiet_NaN();
    auto err_e = std::numeric_limits<double>::quiet_NaN();
    for (int e = 0; e <= 1; e++) {
      char* buffer = e ? storage_e : storage_f;
      double temp;
      if (!integer) {
        char format[6];
        for (int i = 0; i <= 18; i++) {
          format[0] = '%';
          format[1] = '.';
          if (i < 10) {
            format[2] = '0' + i;
            format[3] = e ? 'e' : 'f';
            format[4] = 0;
          } else {
            format[2] = '1';
            format[3] = '0' + (i - 10);
            format[4] = e ? 'e' : 'f';
            format[5] = 0;
          }
          snprintf(buffer, BUFFERSIZE - 1, format, d);
          sscanf(buffer, "%lf", &temp);
          // errv("%.18f, %.18e   =>   %s   =>   %.18f, %.18e   (%d), ", d, d,
          // buffer, temp, temp, temp == d);
          if (temp == d) {
            break;
          }
        }
      } else {
        // integer
        assert(d >= 0);
        if (wasm::isUInteger64(d)) {
          unsigned long long uu = wasm::toUInteger64(d);
          bool asHex = e && !finalize;
          snprintf(buffer, BUFFERSIZE - 1, asHex ? "0x%llx" : "%llu", uu);
          if (asHex) {
            unsigned long long tempULL;
            sscanf(buffer, "%llx", &tempULL);
            temp = (double)tempULL;
          } else {
            sscanf(buffer, "%lf", &temp);
          }
        } else {
          // too large for a machine integer, just use floats
          // even on integers, e with a dot is useful, e.g. 1.2e+200
          snprintf(buffer, BUFFERSIZE - 1, e ? "%e" : "%.0f", d);
          sscanf(buffer, "%lf", &temp);
        }
        // errv("%.18f, %.18e   =>   %s   =>   %.18f, %.18e, %llu   (%d)\n", d,
        //      d, buffer, temp, temp, uu, temp == d);
      }
      (e ? err_e : err_f) = fabs(temp - d);
      // errv("current attempt: %.18f  =>  %s", d, buffer);
      // assert(temp == d);
      char* dot = strchr(buffer, '.');
      if (dot) {
        // remove trailing zeros
        char* end = dot + 1;
        while (*end >= '0' && *end <= '9') {
          end++;
        }
        end--;
        while (*end == '0') {
          char* copy = end;
          do {
            copy[0] = copy[1];
          } while (*copy++ != 0);
          end--;
        }
        // errv("%.18f  =>   %s", d, buffer);
        // remove preceding zeros
        while (*buffer == '0') {
          char* copy = buffer;
          do {
            copy[0] = copy[1];
          } while (*copy++ != 0);
        }
        // errv("%.18f ===>  %s", d, buffer);
      } else if (!integer || !e) {
        // no dot. try to change 12345000 => 12345e3
        char* end = strchr(buffer, 0);
        end--;
        char* test = end;
        // remove zeros, and also doubles can use at most 24 digits, we can
        // truncate any extras even if not zero
        while ((*test == '0' || test - buffer > 24) && test > buffer) {
          test--;
        }
        int num = end - test;
        if (num >= 3) {
          test++;
          test[0] = 'e';
          if (num < 10) {
            test[1] = '0' + num;
            test[2] = 0;
          } else if (num < 100) {
            test[1] = '0' + (num / 10);
            test[2] = '0' + (num % 10);
            test[3] = 0;
          } else {
            assert(num < 1000);
            test[1] = '0' + (num / 100);
            test[2] = '0' + (num % 100) / 10;
            test[3] = '0' + (num % 10);
            test[4] = 0;
          }
        }
      }
      // errv("..current attempt: %.18f  =>  %s", d, buffer);
    }
    // fprintf(stderr, "options:\n%s\n%s\n (first? %d)\n", storage_e, storage_f,
    //         strlen(storage_e) < strlen(storage_f));
    char* ret;
    if (err_e == err_f) {
      ret = strlen(storage_e) < strlen(storage_f) ? storage_e : storage_f;
    } else {
      ret = err_e < err_f ? storage_e : storage_f;
    }
    if (neg) {
      ret--; // safe to go back one, there is one more char in full_*
      *ret = '-';
    }
    return ret;
  }